

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkMulti.c
# Opt level: O2

void Lpk_CreateVarOrder(Kit_DsdNtk_t *pNtk,char (*pTable) [16])

{
  ushort uVar1;
  Kit_DsdObj_t *pKVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  int Below [16];
  int Above [16];
  uint local_cc;
  uint auStack_b8 [16];
  int aiStack_78 [18];
  
  for (uVar9 = 0;
      (uVar9 < pNtk->nNodes && (pKVar2 = pNtk->pNodes[uVar9], pKVar2 != (Kit_DsdObj_t *)0x0));
      uVar9 = uVar9 + 1) {
    uVar10 = 0;
    local_cc = 0;
    for (uVar11 = 0; uVar11 < (uint)*pKVar2 >> 0x1a; uVar11 = uVar11 + 1) {
      uVar1 = *(ushort *)((long)&pKVar2[1].field_0x0 + uVar11 * 2);
      iVar3 = Kit_DsdLitIsLeaf(pNtk,(uint)uVar1);
      if (iVar3 == 0) {
        uVar4 = Kit_DsdLitSupport(pNtk,(uint)uVar1);
        local_cc = local_cc | uVar4;
      }
      else {
        iVar3 = Abc_Lit2Var((uint)uVar1);
        lVar6 = (long)(int)uVar10;
        uVar10 = uVar10 + 1;
        aiStack_78[lVar6] = iVar3;
      }
    }
    uVar4 = 0;
    for (uVar5 = 0; uVar5 != 0x10; uVar5 = uVar5 + 1) {
      if ((local_cc >> (uVar5 & 0x1f) & 1) != 0) {
        lVar6 = (long)(int)uVar4;
        uVar4 = uVar4 + 1;
        auStack_b8[lVar6] = uVar5;
      }
    }
    uVar11 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar11 = 0;
    }
    if ((int)uVar10 < 1) {
      uVar10 = 0;
    }
    for (uVar7 = 0; uVar7 != uVar10; uVar7 = uVar7 + 1) {
      for (uVar8 = 0; uVar11 != uVar8; uVar8 = uVar8 + 1) {
        pTable[aiStack_78[uVar7]][(int)auStack_b8[uVar8]] =
             pTable[aiStack_78[uVar7]][(int)auStack_b8[uVar8]] + '\x01';
      }
    }
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Records variable order.]

  Description [Increaments Order[x][y] by 1 if x should be above y in the DSD.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Lpk_CreateVarOrder( Kit_DsdNtk_t * pNtk, char pTable[][16] )
{
    Kit_DsdObj_t * pObj;
    unsigned uSuppFanins, k;
    int Above[16], Below[16];
    int nAbove, nBelow, iFaninLit, i, x, y;
    // iterate through the nodes
    Kit_DsdNtkForEachObj( pNtk, pObj, i )
    {
        // collect fanin support of this node
        nAbove = 0;
        uSuppFanins = 0;
        Kit_DsdObjForEachFanin( pNtk, pObj, iFaninLit, k )
        {
            if ( Kit_DsdLitIsLeaf( pNtk, iFaninLit ) )
                Above[nAbove++] = Abc_Lit2Var(iFaninLit);
            else
                uSuppFanins |= Kit_DsdLitSupport( pNtk, iFaninLit );
        }
        // find the below variables
        nBelow = 0;
        for ( y = 0; y < 16; y++ )
            if ( uSuppFanins & (1 << y) )
                Below[nBelow++] = y;
        // create all pairs
        for ( x = 0; x < nAbove; x++ )
            for ( y = 0; y < nBelow; y++ )
                pTable[Above[x]][Below[y]]++;
    }
}